

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O0

bool __thiscall higan::HttpContext::ParseRequest(HttpContext *this,Buffer *buffer)

{
  char *begin;
  size_t sVar1;
  ssize_t p_len_1;
  ssize_t p_len;
  size_t len;
  char *data;
  bool result_ok;
  Buffer *buffer_local;
  HttpContext *this_local;
  
  while( true ) {
    while( true ) {
      while( true ) {
        begin = Buffer::ReadBegin(buffer);
        sVar1 = Buffer::ReadableSize(buffer);
        if (this->status_ != PARSE_FIRST_LINE) break;
        sVar1 = ParseFirstLine(this,begin,begin + sVar1);
        if (sVar1 == 0xffffffffffffffff) {
          return false;
        }
        Buffer::AddReadIndex(buffer,sVar1);
      }
      if (this->status_ == PARSE_HEADERS) break;
      if (this->status_ == PARSE_ALL) {
        HttpRequest::AppendBody(&this->request_,begin,begin + sVar1);
        Buffer::Reset(buffer);
        return true;
      }
    }
    sVar1 = ParseHeader(this,begin,begin + sVar1);
    if (sVar1 == 0xffffffffffffffff) break;
    Buffer::AddReadIndex(buffer,sVar1);
  }
  return false;
}

Assistant:

bool HttpContext::ParseRequest(Buffer* buffer)
{
	bool result_ok = true;

	while (true)
	{
		const char* data = buffer->ReadBegin();
		size_t len = buffer->ReadableSize();

		if (status_ == PARSE_FIRST_LINE)
		{
			ssize_t p_len = ParseFirstLine(data, data + len);
			if (p_len == -1)
			{
				result_ok = false;
				break;
			}
			buffer->AddReadIndex(p_len);
		}
		else if (status_ == PARSE_HEADERS)
		{
			ssize_t p_len = ParseHeader(data, data + len);
			if (p_len == -1)
			{
				result_ok = false;
				break;;
			}
			buffer->AddReadIndex(p_len);
		}
		else if (status_ == PARSE_ALL)
		{
			request_.AppendBody(data, data + len);
			buffer->Reset();
			break;
		}
	}
	return result_ok;
}